

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathsimplifier.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_d7297f::PathSimplifier::splitLineAt
          (PathSimplifier *this,
          QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *elements,BVHNode *node,
          quint32 pointIndex,bool processAgain)

{
  long lVar1;
  long lVar2;
  Element *__src;
  bool bVar3;
  int iVar4;
  int iVar5;
  Element *__dest;
  int *piVar6;
  BVHNode *pBVar7;
  BVHNode *pBVar8;
  uint in_ECX;
  undefined4 *in_RDX;
  long in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  BVHNode *right;
  BVHNode *left;
  Element *first;
  QPoint *p;
  QPoint *v;
  QPoint *u;
  Element *element;
  Element *second;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  bool local_11;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(in_RDX + 6);
  QDataBuffer<QPoint>::at(*(QDataBuffer<QPoint> **)(in_RDI + 0x20),(ulong)*(uint *)(lVar2 + 8));
  QDataBuffer<QPoint>::at(*(QDataBuffer<QPoint> **)(in_RDI + 0x20),(ulong)*(uint *)(lVar2 + 0xc));
  QDataBuffer<QPoint>::at(*(QDataBuffer<QPoint> **)(in_RDI + 0x20),(ulong)in_ECX);
  bVar3 = ::operator==((QPoint *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (QPoint *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  if (!bVar3) {
    bVar3 = ::operator==((QPoint *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (QPoint *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    if (!bVar3) {
      if ((in_R8B & 1) != 0) {
        *(ushort *)(lVar2 + 0x38) = *(ushort *)(lVar2 + 0x38) & 0xfeff;
      }
      __src = *(Element **)(in_RDX + 6);
      __dest = ElementAllocator::newElement
                         ((ElementAllocator *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      memcpy(__dest,__src,0x3a);
      __dest->indices[0] = in_ECX;
      __src->indices[1] = in_ECX;
      iVar4 = QPoint::x((QPoint *)0x5eab28);
      iVar5 = QPoint::x((QPoint *)0x5eab36);
      piVar6 = QPoint::rx((QPoint *)0x5eab4e);
      *piVar6 = iVar4 + iVar5 >> 1;
      iVar4 = QPoint::y((QPoint *)0x5eab5e);
      iVar5 = QPoint::y((QPoint *)0x5eab6c);
      piVar6 = QPoint::ry((QPoint *)0x5eab84);
      *piVar6 = iVar4 + iVar5 >> 1;
      iVar4 = QPoint::x((QPoint *)0x5eab94);
      iVar5 = QPoint::x((QPoint *)0x5eaba2);
      piVar6 = QPoint::rx((QPoint *)0x5eabbd);
      *piVar6 = iVar4 + iVar5 >> 1;
      iVar4 = QPoint::y((QPoint *)0x5eabcd);
      iVar5 = QPoint::y((QPoint *)0x5eabdb);
      piVar6 = QPoint::ry((QPoint *)0x5eabf6);
      *piVar6 = iVar4 + iVar5 >> 1;
      QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::add
                ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 (Element **)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      pBVar7 = BoundingVolumeHierarchy::newNode
                         ((BoundingVolumeHierarchy *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      pBVar8 = BoundingVolumeHierarchy::newNode
                         ((BoundingVolumeHierarchy *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      pBVar8->type = Leaf;
      pBVar7->type = Leaf;
      (pBVar7->field_3).element = __src;
      (pBVar8->field_3).element = __dest;
      pBVar8->minimum = *(QPoint *)(in_RDX + 1);
      pBVar7->minimum = pBVar8->minimum;
      pBVar8->maximum = *(QPoint *)(in_RDX + 3);
      pBVar7->maximum = pBVar8->maximum;
      iVar4 = QPoint::x((QPoint *)0x5eacbb);
      iVar5 = QPoint::x((QPoint *)0x5eacc9);
      if (iVar4 < iVar5) {
        iVar4 = QPoint::x((QPoint *)0x5eacdd);
        piVar6 = QPoint::rx((QPoint *)0x5eacef);
        *piVar6 = iVar4;
        piVar6 = QPoint::rx((QPoint *)0x5ead03);
        *piVar6 = iVar4;
      }
      else {
        iVar4 = QPoint::x((QPoint *)0x5ead15);
        piVar6 = QPoint::rx((QPoint *)0x5ead27);
        *piVar6 = iVar4;
        piVar6 = QPoint::rx((QPoint *)0x5ead3b);
        *piVar6 = iVar4;
      }
      iVar4 = QPoint::y((QPoint *)0x5ead4b);
      iVar5 = QPoint::y((QPoint *)0x5ead59);
      if (iVar4 < iVar5) {
        in_stack_ffffffffffffff54 = QPoint::y((QPoint *)0x5ead6d);
        piVar6 = QPoint::ry((QPoint *)0x5ead7f);
        *piVar6 = in_stack_ffffffffffffff54;
        piVar6 = QPoint::ry((QPoint *)0x5ead93);
        *piVar6 = in_stack_ffffffffffffff54;
      }
      else {
        in_stack_ffffffffffffff50 = QPoint::y((QPoint *)0x5eada5);
        piVar6 = QPoint::ry((QPoint *)0x5eadb7);
        *piVar6 = in_stack_ffffffffffffff50;
        piVar6 = QPoint::ry((QPoint *)0x5eadcb);
        *piVar6 = in_stack_ffffffffffffff50;
      }
      *(BVHNode **)&(pBVar7->field_3).left[1].minimum.yp = pBVar7;
      *(BVHNode **)&(pBVar8->field_3).left[1].minimum.yp = pBVar8;
      *in_RDX = 1;
      *(BVHNode **)(in_RDX + 6) = pBVar7;
      *(BVHNode **)(in_RDX + 8) = pBVar8;
      if ((*(ushort *)&__src->field_0x38 >> 8 & 1) == 0) {
        QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::add
                  ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (Element **)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
        QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::add
                  ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (Element **)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      }
      local_11 = true;
      goto LAB_005eae72;
    }
  }
  local_11 = false;
LAB_005eae72:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool PathSimplifier::splitLineAt(QDataBuffer<Element *> &elements, BVHNode *node,
                                 quint32 pointIndex, bool processAgain)
{
    Q_ASSERT(node->type == BVHNode::Leaf);
    Element *element = node->element;
    Q_ASSERT(element->degree == Element::Line);
    const QPoint &u = m_points->at(element->indices[0]);
    const QPoint &v = m_points->at(element->indices[1]);
    const QPoint &p = m_points->at(pointIndex);
    if (u == p || v == p)
        return false; // No split needed.

    if (processAgain)
        element->processed = false; // Needs to be processed again.

    Element *first = node->element;
    Element *second = m_elementAllocator.newElement();
    *second = *first;
    first->indices[1] = second->indices[0] = pointIndex;
    first->middle.rx() = (u.x() + p.x()) >> 1;
    first->middle.ry() = (u.y() + p.y()) >> 1;
    second->middle.rx() = (v.x() + p.x()) >> 1;
    second->middle.ry() = (v.y() + p.y()) >> 1;
    m_elements.add(second);

    BVHNode *left = m_bvh.newNode();
    BVHNode *right = m_bvh.newNode();
    left->type = right->type = BVHNode::Leaf;
    left->element = first;
    right->element = second;
    left->minimum = right->minimum = node->minimum;
    left->maximum = right->maximum = node->maximum;
    if (u.x() < v.x())
        left->maximum.rx() = right->minimum.rx() = p.x();
    else
        left->minimum.rx() = right->maximum.rx() = p.x();
    if (u.y() < v.y())
        left->maximum.ry() = right->minimum.ry() = p.y();
    else
        left->minimum.ry() = right->maximum.ry() = p.y();
    left->element->bvhNode = left;
    right->element->bvhNode = right;

    node->type = BVHNode::Split;
    node->left = left;
    node->right = right;

    if (!first->processed) {
        elements.add(left->element);
        elements.add(right->element);
    }
    return true;
}